

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  Location loc;
  ulong uVar1;
  size_t i;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  undefined1 auStack_f8 [8];
  Token token;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  size_type *local_50;
  string expected_str;
  
  Consume((Token *)auStack_f8,this);
  local_50 = &expected_str._M_string_length;
  expected_str._M_dataplus._M_p = (pointer)0x0;
  expected_str._M_string_length._0_1_ = 0;
  if ((expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::assign((string *)&local_50,", expected ");
    lVar4 = 0;
    for (uVar2 = 0;
        uVar1 = (long)(expected->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(expected->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5, uVar2 < uVar1;
        uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        pcVar3 = " or ";
        if (uVar2 != uVar1 - 1) {
          pcVar3 = ", ";
        }
        std::__cxx11::string::append((string *)&local_50,pcVar3);
      }
      std::__cxx11::string::append
                ((string *)&local_50,
                 (string *)
                 ((long)&(((expected->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      lVar4 = lVar4 + 0x20;
    }
    if (example != (char *)0x0) {
      std::__cxx11::string::append((string *)&local_50," (e.g. ");
      std::__cxx11::string::append((string *)&local_50,example);
      std::__cxx11::string::append((string *)&local_50,")");
    }
  }
  Token::to_string_clamp_abi_cxx11_
            ((string *)((long)&token.field_2.literal_.text.field_2 + 8),(Token *)auStack_f8,0x50);
  uStack_80 = SUB84(token.loc.filename.data_,0);
  uStack_7c = (undefined4)((ulong)token.loc.filename.data_ >> 0x20);
  local_78 = (undefined4)token.loc.filename.size_;
  uStack_74 = (undefined4)(token.loc.filename.size_ >> 0x20);
  uStack_70 = token.loc.field_1._0_4_;
  uStack_6c = token.loc.field_1._4_4_;
  loc.filename.size_._0_4_ = uStack_80;
  loc.filename.data_ = (char *)auStack_f8;
  loc.filename.size_._4_4_ = uStack_7c;
  loc.field_1.field_0.line = local_78;
  loc.field_1.field_0.first_column = uStack_74;
  loc.field_1.field_0.last_column = uStack_70;
  loc.field_1._12_4_ = uStack_6c;
  Error(this,loc,"unexpected token \"%s\"%s.",token.field_2._32_8_,local_50,in_R8,in_R9);
  std::__cxx11::string::~string((string *)(token.field_2.literal_.text.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  Token::~Token((Token *)auStack_f8);
  return (Result)Error;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}